

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_rand.c
# Opt level: O2

void evutil_secure_rng_add_bytes(char *buf,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0x7fffffff;
  if (n < 0x7fffffff) {
    uVar2 = n;
  }
  if (arc4rand_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,arc4rand_lock);
  }
  if (rs_initialized == '\0') {
    arc4_stir();
  }
  uVar1 = uVar2 & 0xffffffff;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 0x100) {
    arc4_addrandom((uchar *)(buf + uVar3),(int)uVar1);
    uVar1 = (ulong)((int)uVar1 - 0x100);
  }
  if (arc4rand_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,arc4rand_lock);
    return;
  }
  return;
}

Assistant:

void
evutil_secure_rng_add_bytes(const char *buf, size_t n)
{
	arc4random_addrandom((unsigned char*)buf,
	    n>(size_t)INT_MAX ? INT_MAX : (int)n);
}